

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O3

size_t coda_base58_encode_alloc(char *in,size_t inlen,char **out)

{
  size_t sVar1;
  char *out_00;
  size_t sVar2;
  long lVar3;
  size_t __size;
  
  if (inlen == 0) {
    lVar3 = 0;
  }
  else {
    sVar2 = 0;
    sVar1 = inlen;
    do {
      if (in[sVar2] != '\0') goto LAB_001017d7;
      sVar2 = sVar2 + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    sVar1 = 0;
    sVar2 = inlen;
LAB_001017d7:
    lVar3 = (sVar1 * 0x8a) / 100 + sVar2;
  }
  __size = lVar3 + 2;
  out_00 = (char *)malloc(__size);
  *out = out_00;
  if (out_00 != (char *)0x0) {
    coda_base58_encode(in,inlen,out_00,__size);
    __size = lVar3 + 1;
  }
  return __size;
}

Assistant:

size_t coda_base58_encode_alloc (const char *in, size_t inlen, char **out)
{
    size_t zeroes = 0;
    size_t nonzero_inlen = inlen;
    while (nonzero_inlen && !in[zeroes])
    {
        zeroes++;
        nonzero_inlen--;
    }

    size_t outlen = zeroes + nonzero_inlen * 138 / 100 + 2;

    *out = malloc (outlen);
    if (!*out)
        return outlen;

    coda_base58_encode (in, inlen, *out, outlen);
    return outlen - 1;
}